

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmemory.h
# Opt level: O0

MaybeStackArray<const_icu_63::numparse::impl::NumberParseMatcher_*,_3> * __thiscall
icu_63::MaybeStackArray<const_icu_63::numparse::impl::NumberParseMatcher_*,_3>::operator=
          (MaybeStackArray<const_icu_63::numparse::impl::NumberParseMatcher_*,_3> *this,
          MaybeStackArray<const_icu_63::numparse::impl::NumberParseMatcher_*,_3> *src)

{
  MaybeStackArray<const_icu_63::numparse::impl::NumberParseMatcher_*,_3> *src_local;
  MaybeStackArray<const_icu_63::numparse::impl::NumberParseMatcher_*,_3> *this_local;
  
  releaseArray(this);
  this->capacity = src->capacity;
  this->needToRelease = src->needToRelease;
  if (src->ptr == src->stackArray) {
    this->ptr = this->stackArray;
    memcpy(this->stackArray,src->stackArray,(long)src->capacity << 3);
  }
  else {
    this->ptr = src->ptr;
    resetToStackArray(src);
  }
  return this;
}

Assistant:

inline MaybeStackArray <T, stackCapacity>&
MaybeStackArray<T, stackCapacity>::operator=(MaybeStackArray <T, stackCapacity>&& src) U_NOEXCEPT {
    releaseArray();  // in case this instance had its own memory allocated
    capacity = src.capacity;
    needToRelease = src.needToRelease;
    if (src.ptr == src.stackArray) {
        ptr = stackArray;
        uprv_memcpy(stackArray, src.stackArray, sizeof(T) * src.capacity);
    } else {
        ptr = src.ptr;
        src.resetToStackArray();  // take ownership away from src
    }
    return *this;
}